

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::removeExistingMemories(MultiMemoryLowering *this)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(wasm::Memory_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp:687:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wasm::Memory_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp:687:26)>
             ::_M_manager;
  Module::removeMemories(this->wasm,(function<bool_(wasm::Memory_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void removeExistingMemories() {
    wasm->removeMemories([&](Memory* curr) { return true; });
  }